

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerSharedInputState.hpp
# Opt level: O3

void __thiscall antlr::LexerInputState::initialize(LexerInputState *this,istream *in,char *file)

{
  char *pcVar1;
  CharBuffer *this_00;
  
  this->column = 1;
  this->line = 1;
  this->tokenStartColumn = 1;
  this->tokenStartLine = 1;
  this->guessing = 0;
  pcVar1 = (char *)(this->filename)._M_string_length;
  strlen(file);
  std::__cxx11::string::_M_replace((ulong)&this->filename,0,pcVar1,(ulong)file);
  if ((this->input != (InputBuffer *)0x0) && (this->inputResponsible == true)) {
    (*this->input->_vptr_InputBuffer[1])();
  }
  this_00 = (CharBuffer *)operator_new(0x40);
  CharBuffer::CharBuffer(this_00,in);
  this->input = (InputBuffer *)this_00;
  this->inputResponsible = true;
  return;
}

Assistant:

virtual void initialize( ANTLR_USE_NAMESPACE(std)istream& in, const char* file = "" )
	{
		column = 1;
		line = 1;
		tokenStartColumn = 1;
		tokenStartLine = 1;
		guessing = 0;
		filename = file;

		if( input && inputResponsible )
			delete input;

		input = new CharBuffer(in);
		inputResponsible = true;
	}